

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_byte_alignment(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *local_50;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  int byte_alignment;
  int max_byte_alignment;
  int min_byte_alignment;
  int legacy_byte_alignment;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_50 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_50 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = local_50 + 2;
  }
  uVar1 = *local_50;
  if ((uVar1 == 0) || (((0x1f < (int)uVar1 && ((int)uVar1 < 0x401)) && ((uVar1 & uVar1 - 1) == 0))))
  {
    ctx->byte_alignment = uVar1;
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(uint *)(*ctx->frame_worker->data1 + 0x3d60) = uVar1;
    }
    local_4 = AOM_CODEC_OK;
  }
  else {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_byte_alignment(aom_codec_alg_priv_t *ctx,
                                               va_list args) {
  const int legacy_byte_alignment = 0;
  const int min_byte_alignment = 32;
  const int max_byte_alignment = 1024;
  const int byte_alignment = va_arg(args, int);

  if (byte_alignment != legacy_byte_alignment &&
      (byte_alignment < min_byte_alignment ||
       byte_alignment > max_byte_alignment ||
       (byte_alignment & (byte_alignment - 1)) != 0))
    return AOM_CODEC_INVALID_PARAM;

  ctx->byte_alignment = byte_alignment;
  if (ctx->frame_worker) {
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    frame_worker_data->pbi->common.features.byte_alignment = byte_alignment;
  }
  return AOM_CODEC_OK;
}